

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,
          Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *matcher,char *file,int line,DeathTest **test)

{
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *pMVar1;
  bool bVar2;
  int iVar3;
  TestInfo *this_00;
  char *pcVar4;
  string *__lhs;
  ExecDeathTest *this_01;
  NoExecDeathTest *this_02;
  int __c;
  int __c_00;
  int __c_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_169;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_168;
  undefined1 local_149;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_148;
  int local_12c;
  string local_128;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  int local_54;
  InternalRunDeathTestFlag *pIStack_50;
  int death_test_index;
  InternalRunDeathTestFlag *flag;
  UnitTestImpl *impl;
  DeathTest **test_local;
  char *pcStack_30;
  int line_local;
  char *file_local;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *matcher_local;
  char *statement_local;
  DefaultDeathTestFactory *this_local;
  
  impl = (UnitTestImpl *)test;
  test_local._4_4_ = line;
  pcStack_30 = file;
  file_local = (char *)matcher;
  matcher_local =
       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        *)statement;
  statement_local = (char *)this;
  flag = (InternalRunDeathTestFlag *)GetUnitTestImpl();
  pIStack_50 = UnitTestImpl::internal_run_death_test_flag((UnitTestImpl *)flag);
  this_00 = UnitTestImpl::current_test_info((UnitTestImpl *)flag);
  iVar3 = testing::TestInfo::increment_death_test_count(this_00);
  local_54 = iVar3;
  if (pIStack_50 != (InternalRunDeathTestFlag *)0x0) {
    pcVar4 = InternalRunDeathTestFlag::index(pIStack_50,statement,__c);
    if ((int)pcVar4 < iVar3) {
      StreamableToString<int>(&local_f8,&local_54);
      std::operator+(&local_d8,"Death test count (",&local_f8);
      __lhs_00 = &local_d8;
      std::operator+(&local_b8,__lhs_00,") somehow exceeded expected maximum (");
      pcVar4 = InternalRunDeathTestFlag::index(pIStack_50,(char *)__lhs_00,__c_00);
      local_12c = (int)pcVar4;
      StreamableToString<int>(&local_128,&local_12c);
      std::operator+(&local_98,&local_b8,&local_128);
      std::operator+(&local_78,&local_98,")");
      DeathTest::set_last_death_test_message(&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      return false;
    }
    __lhs = InternalRunDeathTestFlag::file_abi_cxx11_(pIStack_50);
    pcVar4 = pcStack_30;
    bVar2 = std::operator==(__lhs,pcStack_30);
    if (((!bVar2) || (iVar3 = InternalRunDeathTestFlag::line(pIStack_50), iVar3 != test_local._4_4_)
        ) || (pcVar4 = InternalRunDeathTestFlag::index(pIStack_50,pcVar4,__c_01),
             (int)pcVar4 != local_54)) {
      impl->_vptr_UnitTestImpl = (_func_int **)0x0;
      return true;
    }
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          FLAGS_gtest_death_test_style_abi_cxx11_,"threadsafe");
  if (bVar2) {
    this_01 = (ExecDeathTest *)operator_new(0x50);
    pMVar1 = matcher_local;
    local_149 = 1;
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::Matcher(&local_148,matcher);
    ExecDeathTest::ExecDeathTest(this_01,(char *)pMVar1,&local_148,pcStack_30,test_local._4_4_);
    local_149 = 0;
    impl->_vptr_UnitTestImpl = (_func_int **)this_01;
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher(&local_148);
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            FLAGS_gtest_death_test_style_abi_cxx11_,"fast");
    if (!bVar2) {
      std::operator+(&local_1b0,"Unknown death test style \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FLAGS_gtest_death_test_style_abi_cxx11_);
      std::operator+(&local_190,&local_1b0,"\" encountered");
      DeathTest::set_last_death_test_message(&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      return false;
    }
    this_02 = (NoExecDeathTest *)operator_new(0x40);
    pMVar1 = matcher_local;
    local_169 = 1;
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::Matcher(&local_168,matcher);
    NoExecDeathTest::NoExecDeathTest(this_02,(char *)pMVar1,&local_168);
    local_169 = 0;
    impl->_vptr_UnitTestImpl = (_func_int **)this_02;
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher(&local_168);
  }
  return true;
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement,
                                     Matcher<const std::string&> matcher,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index =
      impl->current_test_info()->increment_death_test_count();

  if (flag != nullptr) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(
          "Death test count (" + StreamableToString(death_test_index) +
          ") somehow exceeded expected maximum (" +
          StreamableToString(flag->index()) + ")");
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = nullptr;
      return true;
    }
  }

#ifdef GTEST_OS_WINDOWS

  if (GTEST_FLAG_GET(death_test_style) == "threadsafe" ||
      GTEST_FLAG_GET(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, std::move(matcher), file, line);
  }

#elif defined(GTEST_OS_FUCHSIA)

  if (GTEST_FLAG_GET(death_test_style) == "threadsafe" ||
      GTEST_FLAG_GET(death_test_style) == "fast") {
    *test = new FuchsiaDeathTest(statement, std::move(matcher), file, line);
  }

#else

  if (GTEST_FLAG_GET(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, std::move(matcher), file, line);
  } else if (GTEST_FLAG_GET(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, std::move(matcher));
  }

#endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message("Unknown death test style \"" +
                                           GTEST_FLAG_GET(death_test_style) +
                                           "\" encountered");
    return false;
  }